

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *this_00;
  char *in_RCX;
  Maybe<kj::Own<kj::TaskSet::Task>_> *pMVar1;
  Vector<kj::String> traces;
  ArrayBuilder<kj::String> local_58;
  Array<char> local_38;
  
  local_58.endPtr = (String *)0x0;
  local_58.ptr = (String *)0x0;
  local_58.pos = (RemoveConst<kj::String> *)0x0;
  for (pMVar1 = &this->tasks; this_00 = (pMVar1->ptr).ptr, this_00 != (Task *)0x0;
      pMVar1 = &((pMVar1->ptr).ptr)->next) {
    _::Event::trace((String *)&local_38,&this_00->super_Event);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_58,(String *)&local_38);
    Array<char>::~Array(&local_38);
  }
  strArray<kj::Vector<kj::String>&>
            (__return_storage_ptr__,(kj *)&local_58,
             (Vector<kj::String> *)"\n============================================\n",in_RCX);
  ArrayBuilder<kj::String>::dispose(&local_58);
  return __return_storage_ptr__;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<Own<Task>>* ptr = &tasks;
  for (;;) {
    KJ_IF_MAYBE(task, *ptr) {
      traces.add(task->get()->trace());
      ptr = &task->get()->next;
    } else {
      break;
    }
  }